

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O2

IReferenceCounters * __thiscall
Diligent::RefCountedObject<Diligent::ITextureGL>::GetReferenceCounters
          (RefCountedObject<Diligent::ITextureGL> *this)

{
  RefCountersImpl *pRVar1;
  char (*in_RCX) [26];
  string msg;
  string local_30;
  
  pRVar1 = this->m_pRefCounters;
  if (pRVar1 == (RefCountersImpl *)0x0) {
    FormatString<char[26],char[26]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetReferenceCounters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
               ,0x21b);
    std::__cxx11::string::~string((string *)&local_30);
    pRVar1 = this->m_pRefCounters;
  }
  return &pRVar1->super_IReferenceCounters;
}

Assistant:

GetReferenceCounters() const override final
    {
        VERIFY_EXPR(m_pRefCounters != nullptr);
        return m_pRefCounters;
    }